

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O1

QString * __thiscall
QtMWidgets::Section::value(QString *__return_storage_ptr__,Section *this,QDateTime *dt)

{
  Type TVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QArrayData *pQVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  QByteArrayView QVar9;
  QLatin1String QVar10;
  QLatin1String QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QByteArrayView QVar18;
  QString v;
  QString local_68;
  QArrayData *local_48;
  char16_t *local_40;
  qsizetype local_38;
  undefined8 local_30;
  undefined4 local_24;
  
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char16_t *)0x0;
  local_68.d.size = 0;
  TVar1 = this->type;
  if (0x7f < (int)TVar1) {
    if (0x3ff < (int)TVar1) {
      if (TVar1 != MonthSectionLong) {
        if (TVar1 == YearSection) {
          local_30 = QDateTime::date();
          uVar6 = QDate::year();
          if ((uVar6 < 10) && (this->zeroesAdded != false)) {
            QVar17.m_data = (char *)0x1;
            QVar17.m_size = (qsizetype)&local_68;
            QString::append(QVar17);
          }
          QString::number((int)&local_48,uVar6);
          QString::append(&local_68);
          goto LAB_00171ef9;
        }
        if (TVar1 == YearSection2Digits) {
          local_30 = QDateTime::date();
          uVar6 = QDate::year();
          if ((uVar6 < 10) && (this->zeroesAdded != false)) {
            QVar11.m_data = (char *)0x1;
            QVar11.m_size = (qsizetype)&local_68;
            QString::append(QVar11);
          }
          QString::number((int)&local_48,uVar6);
          QString::append(&local_68);
          if (local_48 != (QArrayData *)0x0) {
            LOCK();
            (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_48,2,8);
            }
          }
          QString::right((longlong)__return_storage_ptr__);
          goto LAB_00171f57;
        }
      }
      goto switchD_00171ae6_caseD_3;
    }
    if (TVar1 == DaySectionLong) {
LAB_00171ba1:
      local_30 = QDateTime::date();
      uVar6 = QDate::day();
      if ((uVar6 < 10) && (this->zeroesAdded != false)) {
        QVar10.m_data = (char *)0x1;
        QVar10.m_size = (qsizetype)&local_68;
        QString::append(QVar10);
      }
      QString::number((int)&local_48,uVar6);
      QString::append(&local_68);
    }
    else {
      if (TVar1 != MonthSection) goto switchD_00171ae6_caseD_3;
      local_30 = QDateTime::date();
      uVar6 = QDate::month();
      if ((uVar6 < 10) && (this->zeroesAdded != false)) {
        QVar16.m_data = (char *)0x1;
        QVar16.m_size = (qsizetype)&local_68;
        QString::append(QVar16);
      }
      QString::number((int)&local_48,uVar6);
      QString::append(&local_68);
    }
    goto LAB_00171ef9;
  }
  if (0xf < (int)TVar1) {
    if (TVar1 != Hour24Section) {
      if ((TVar1 == DaySection) || (TVar1 == DaySectionShort)) goto LAB_00171ba1;
      goto switchD_00171ae6_caseD_3;
    }
    uVar8 = QDateTime::time();
    local_30 = CONCAT44(local_30._4_4_,uVar8);
    uVar6 = QTime::hour();
    if ((uVar6 < 10) && (this->zeroesAdded != false)) {
      QVar15.m_data = (char *)0x1;
      QVar15.m_size = (qsizetype)&local_68;
      QString::append(QVar15);
    }
    QString::number((int)&local_48,uVar6);
    QString::append(&local_68);
    goto LAB_00171ef9;
  }
  switch(TVar1) {
  case AmPmSection:
    uVar8 = QDateTime::time();
    local_48 = (QArrayData *)CONCAT44(local_48._4_4_,uVar8);
    iVar5 = QTime::hour();
    if (iVar5 < 0xd) {
LAB_00171b1e:
      local_24 = QDateTime::time();
      iVar5 = QTime::hour();
      if (iVar5 == 0) goto LAB_00171f86;
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      QVar9.m_data = (storage_type *)0x2;
      QVar9.m_size = (qsizetype)&local_48;
      QString::fromLatin1(QVar9);
    }
    else {
      uVar8 = QDateTime::time();
      local_30 = CONCAT44(local_30._4_4_,uVar8);
      iVar5 = QTime::hour();
      if (0x17 < iVar5) goto LAB_00171b1e;
LAB_00171f86:
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      QVar18.m_data = (storage_type *)0x2;
      QVar18.m_size = (qsizetype)&local_48;
      QString::fromLatin1(QVar18);
    }
    pQVar4 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    (__return_storage_ptr__->d).d = (Data *)local_48;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).ptr = local_40;
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_38;
    local_48 = pQVar4;
    local_40 = pcVar2;
    local_38 = qVar3;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,8);
      }
    }
    goto LAB_00171f57;
  case SecondSection:
    uVar8 = QDateTime::time();
    local_30 = CONCAT44(local_30._4_4_,uVar8);
    uVar6 = QTime::second();
    if ((uVar6 < 10) && (this->zeroesAdded != false)) {
      QVar14.m_data = (char *)0x1;
      QVar14.m_size = (qsizetype)&local_68;
      QString::append(QVar14);
    }
    QString::number((int)&local_48,uVar6);
    QString::append(&local_68);
    break;
  default:
    goto switchD_00171ae6_caseD_3;
  case MinuteSection:
    uVar8 = QDateTime::time();
    local_30 = CONCAT44(local_30._4_4_,uVar8);
    uVar6 = QTime::minute();
    if ((uVar6 < 10) && (this->zeroesAdded != false)) {
      QVar13.m_data = (char *)0x1;
      QVar13.m_size = (qsizetype)&local_68;
      QString::append(QVar13);
    }
    QString::number((int)&local_48,uVar6);
    QString::append(&local_68);
    break;
  case Hour12Section:
    uVar8 = QDateTime::time();
    local_48 = (QArrayData *)CONCAT44(local_48._4_4_,uVar8);
    uVar7 = QTime::hour();
    uVar6 = 0xc;
    if (uVar7 != 0) {
      uVar6 = uVar7;
    }
    if (0xc < (int)uVar7) {
      uVar6 = uVar7 - 0xc;
    }
    if ((uVar6 < 10) && (this->zeroesAdded != false)) {
      QVar12.m_data = (char *)0x1;
      QVar12.m_size = (qsizetype)&local_68;
      QString::append(QVar12);
    }
    QString::number((int)&local_48,uVar6);
    QString::append(&local_68);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,8);
      }
    }
    goto switchD_00171ae6_caseD_3;
  }
LAB_00171ef9:
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
LAB_00171f28:
  (__return_storage_ptr__->d).d = local_68.d.d;
  local_68.d.d = (Data *)0x0;
  pcVar2 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).ptr = local_68.d.ptr;
  qVar3 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_68.d.size;
  local_68.d.ptr = pcVar2;
  local_68.d.size = qVar3;
LAB_00171f57:
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
    }
  }
  return __return_storage_ptr__;
switchD_00171ae6_caseD_3:
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  goto LAB_00171f28;
}

Assistant:

QString
Section::value( const QDateTime & dt ) const
{
	QString v;

	switch( type )
	{
		case AmPmSection :
			if( ( dt.time().hour() > 12 && dt.time().hour() <= 23 ) ||
				dt.time().hour() == 0 )
					return QLatin1String( "PM" );
			else
				return QLatin1String( "AM" );
		break;

		case SecondSection :
		{
			makeSectionValue( v, dt.time().second(), zeroesAdded );
			return v;
		}
		break;

		case MinuteSection :
		{
			makeSectionValue( v, dt.time().minute(), zeroesAdded );
			return v;
		}
		break;

		case Hour12Section :
		{
			int hour = dt.time().hour();

			if( hour > 12 )
				hour -= 12;
			else if( hour == 0 )
				hour = 12;

			makeSectionValue( v, hour, zeroesAdded );

			return v;
		}
		break;

		case Hour24Section :
		{
			makeSectionValue( v, dt.time().hour(), zeroesAdded );
			return v;
		}
		break;

		case DaySection :
		case DaySectionShort :
		case DaySectionLong :
		{
			makeSectionValue( v, dt.date().day(), zeroesAdded );
			return v;
		}
		break;

		case MonthSection :
		{
			makeSectionValue( v, dt.date().month(), zeroesAdded );
			return v;
		}
		break;

		case MonthSectionShort :
		case MonthSectionLong :
			return v;
		break;

		case YearSection :
		{
			makeSectionValue( v, dt.date().year(), zeroesAdded );
			return v;
		}
		break;

		case YearSection2Digits :
		{
			makeSectionValue( v, dt.date().year(), zeroesAdded );
			return v.right( 2 );
		}
		break;

		default :
			return v;
		break;
	}

	return v;
}